

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

int Abc_NtkMiterIsConstant(Abc_Ntk_t *pMiter)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int i;
  
  if (pMiter->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pMiter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x2ae,"int Abc_NtkMiterIsConstant(Abc_Ntk_t *)");
  }
  i = 0;
  do {
    if (pMiter->vPos->nSize <= i) {
      return 1;
    }
    pAVar2 = Abc_NtkPo(pMiter,i);
    pAVar2 = Abc_ObjChild0(pAVar2);
    iVar1 = Abc_AigNodeIsConst(pAVar2);
    if (iVar1 == 0) {
      return -1;
    }
    pAVar3 = Abc_AigConst1(pMiter);
    if (pAVar3 != (Abc_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe)) {
      __assert_fail("Abc_ObjRegular(pChild) == Abc_AigConst1(pMiter)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                    ,0x2b5,"int Abc_NtkMiterIsConstant(Abc_Ntk_t *)");
    }
    i = i + 1;
  } while (((ulong)pAVar2 & 1) != 0);
  return 0;
}

Assistant:

int Abc_NtkMiterIsConstant( Abc_Ntk_t * pMiter )
{
    Abc_Obj_t * pNodePo, * pChild;
    int i;
    assert( Abc_NtkIsStrash(pMiter) );
    Abc_NtkForEachPo( pMiter, pNodePo, i )
    {
        pChild = Abc_ObjChild0( pNodePo );
        // check if the output is constant 1
        if ( Abc_AigNodeIsConst(pChild) )
        {
            assert( Abc_ObjRegular(pChild) == Abc_AigConst1(pMiter) );
            if ( !Abc_ObjIsComplement(pChild) )
            {
                // if the miter is constant 1, return immediately
//                printf( "MITER IS CONSTANT 1!\n" );
                return 0;
            }
        }
/*
        // check if the output is not constant 0
        else if ( Abc_ObjRegular(pChild)->fPhase != (unsigned)Abc_ObjIsComplement(pChild) )
        {
            return 0;
        }
*/
        // if the miter is undecided (or satisfiable), return immediately
        else 
            return -1;
    }
    // return 1, meaning all outputs are constant zero
    return 1;
}